

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

QColor QStyleHelper::backgroundColor(QPalette *pal,QWidget *widget)

{
  long lVar1;
  QColor QVar2;
  QScrollBar *pQVar3;
  QObject *pQVar4;
  QAbstractScrollArea *pQVar5;
  QColor *pQVar6;
  long in_FS_OFFSET;
  ColorRole in_stack_ffffffffffffffcc;
  QWidget *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = qobject_cast<QScrollBar_const*>((QObject *)0x41959a);
  if (pQVar3 != (QScrollBar *)0x0) {
    pQVar4 = QObject::parent((QObject *)0x4195aa);
    if (pQVar4 != (QObject *)0x0) {
      QObject::parent((QObject *)0x4195ba);
      QObject::parent((QObject *)0x4195c2);
      pQVar5 = qobject_cast<QAbstractScrollArea_const*>((QObject *)0x4195ca);
      if (pQVar5 != (QAbstractScrollArea *)0x0) {
        QWidget::parentWidget((QWidget *)0x4195da);
        QWidget::parentWidget((QWidget *)0x4195e2);
        QWidget::palette(in_stack_ffffffffffffffd0);
        pQVar6 = QPalette::color((QPalette *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        local_18 = *(undefined8 *)pQVar6;
        local_10 = *(undefined8 *)((long)&pQVar6->ct + 4);
        goto LAB_0041962a;
      }
    }
  }
  pQVar6 = QPalette::color((QPalette *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  local_18 = *(undefined8 *)pQVar6;
  local_10 = *(undefined8 *)((long)&pQVar6->ct + 4);
LAB_0041962a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2._8_8_ = local_10;
    QVar2._0_8_ = local_18;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QColor backgroundColor(const QPalette &pal, const QWidget* widget)
{
#if QT_CONFIG(scrollarea)
    if (qobject_cast<const QScrollBar *>(widget) && widget->parent() &&
            qobject_cast<const QAbstractScrollArea *>(widget->parent()->parent()))
        return widget->parentWidget()->parentWidget()->palette().color(QPalette::Base);
#else
    Q_UNUSED(widget);
#endif
    return pal.color(QPalette::Base);
}